

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O3

void Gia_ManQuantSetSuppStart(Gia_Man_t *p)

{
  Vec_Wrd_t *p_00;
  word *pwVar1;
  
  if (p->nObjs != 1) {
    __assert_fail("Gia_ManObjNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaExist.c"
                  ,0x66,"void Gia_ManQuantSetSuppStart(Gia_Man_t *)");
  }
  if (p->vSuppWords == (Vec_Wrd_t *)0x0) {
    if ((p->vSuppVars).nSize == 0) {
      p->iSuppPi = 0;
      p->nSuppWords = 1;
      p_00 = (Vec_Wrd_t *)malloc(0x10);
      p_00->nCap = 1000;
      p_00->nSize = 0;
      pwVar1 = (word *)malloc(8000);
      p_00->pArray = pwVar1;
      p->vSuppWords = p_00;
      Vec_WrdPush(p_00,0);
      return;
    }
    __assert_fail("Vec_IntSize(&p->vSuppVars) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaExist.c"
                  ,0x68,"void Gia_ManQuantSetSuppStart(Gia_Man_t *)");
  }
  __assert_fail("p->vSuppWords == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaExist.c"
                ,0x67,"void Gia_ManQuantSetSuppStart(Gia_Man_t *)");
}

Assistant:

void Gia_ManQuantSetSuppStart( Gia_Man_t * p )
{
    assert( Gia_ManObjNum(p) == 1 );
    assert( p->vSuppWords == NULL );
    assert( Vec_IntSize(&p->vSuppVars) == 0 );
    p->iSuppPi    = 0;
    p->nSuppWords = 1;
    p->vSuppWords = Vec_WrdAlloc( 1000 );
    Vec_WrdPush( p->vSuppWords, 0 );
}